

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

double __thiscall
despot::Parser::ObsProb
          (Parser *this,OBS_TYPE obs,vector<int,_std::allocator<int>_> *state,ACT_TYPE action)

{
  pointer piVar1;
  pointer pNVar2;
  CPT *pCVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  
  piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar6 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    piVar7 = &(((this->curr_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
    lVar8 = 0;
    do {
      *piVar7 = piVar1[lVar8];
      lVar8 = lVar8 + 1;
      piVar7 = piVar7 + 0x30;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  uVar5 = (int)((ulong)((long)(this->obs_vars_).
                              super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->obs_vars_).
                             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111 - 1;
  if ((int)uVar5 < 0) {
    dVar10 = 1.0;
  }
  else {
    lVar8 = (ulong)uVar5 * 0xf + 2;
    dVar10 = 1.0;
    lVar6 = (ulong)uVar5 + 1;
    do {
      pNVar2 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar3 = (this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar6 + -1];
      (*(pCVar3->super_Function)._vptr_Function[5])
                (pCVar3,obs % (ulong)(long)(int)((ulong)((long)(&(pNVar2->super_Variable).
                                                                 _vptr_Variable)[lVar8] -
                                                        *(long *)((long)pNVar2 + lVar8 * 8 + -8)) >>
                                                5) & 0xffffffff);
      dVar10 = dVar10 * extraout_XMM0_Qa;
      pNVar2 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      obs = obs / (ulong)(long)(int)((ulong)((long)(&(pNVar2->super_Variable)._vptr_Variable)[lVar8]
                                            - *(long *)((long)pNVar2 + lVar8 * 8 + -8)) >> 5);
      lVar8 = lVar8 + -0xf;
      lVar9 = lVar6 + -1;
      bVar4 = 0 < lVar6;
      lVar6 = lVar9;
    } while (lVar9 != 0 && bVar4);
  }
  return dVar10;
}

Assistant:

double Parser::ObsProb(OBS_TYPE obs, const vector<int>& state,
	ACT_TYPE action) const {
	for (int s = 0; s < state.size(); s++) {
		curr_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	double prob = 1.0;
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		prob *= obs_funcs_[o]->GetValue(obs % obs_vars_[o].Size());
		obs /= obs_vars_[o].Size();
	}
	return prob;
}